

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O2

string * gmlc::networking::generateMatchingInterfaceAddress
                   (string *__return_storage_ptr__,string *server,InterfaceNetworks network)

{
  char *__s;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(network >> 1 | network << 7) {
  case LOCAL:
    if (server->_M_string_length == 0) {
      __s = "tcp://127.0.0.1";
      goto LAB_0037529f;
    }
    getLocalExternalAddress(&local_30,server);
    break;
  default:
    goto switchD_00375229_caseD_1;
  case 2:
    if (server->_M_string_length == 0) {
LAB_0037528f:
      __s = "tcp://*";
LAB_0037529f:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,__s);
      return __return_storage_ptr__;
    }
    getLocalExternalAddressV4(&local_30,server);
    break;
  case 3:
    if (server->_M_string_length == 0) goto LAB_0037528f;
    getLocalExternalAddressV6(&local_30,server);
    break;
  case 5:
    if (server->_M_string_length == 0) goto LAB_0037528f;
    getLocalExternalAddress(&local_30,server);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
switchD_00375229_caseD_1:
  return __return_storage_ptr__;
}

Assistant:

std::string generateMatchingInterfaceAddress(
    const std::string& server,
    InterfaceNetworks network)
{
    std::string newInterface;
    switch (network) {
        case InterfaceNetworks::LOCAL:
            if (server.empty()) {
                newInterface = "tcp://127.0.0.1";
            } else {
                newInterface = getLocalExternalAddress(server);
            }
            break;
        case InterfaceNetworks::IPV4:
            if (server.empty()) {
                newInterface = "tcp://*";
            } else {
                newInterface = getLocalExternalAddressV4(server);
            }
            break;
        case InterfaceNetworks::IPV6:
            if (server.empty()) {
                newInterface = "tcp://*";
            } else {
                newInterface = getLocalExternalAddressV6(server);
            }
            break;
        case InterfaceNetworks::ALL:
            if (server.empty()) {
                newInterface = "tcp://*";
            } else {
                newInterface = getLocalExternalAddress(server);
            }
            break;
    }
    return newInterface;
}